

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O0

Ignored __thiscall
re2::CaptureNamesWalker::ShortVisit(CaptureNamesWalker *this,Regexp *re,Ignored ignored)

{
  ostream *poVar1;
  LogMessage local_1a0;
  Ignored local_1c;
  Regexp *pRStack_18;
  Ignored ignored_local;
  Regexp *re_local;
  CaptureNamesWalker *this_local;
  
  local_1c = ignored;
  pRStack_18 = re;
  re_local = (Regexp *)this;
  LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_1a0,
             "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/regexp.cc",0x25c)
  ;
  poVar1 = LogMessage::stream(&local_1a0);
  std::operator<<(poVar1,"CaptureNamesWalker::ShortVisit called");
  LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1a0);
  return local_1c;
}

Assistant:

virtual Ignored ShortVisit(Regexp* re, Ignored ignored) {
    // Should never be called: we use Walk not WalkExponential.
    LOG(DFATAL) << "CaptureNamesWalker::ShortVisit called";
    return ignored;
  }